

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlMemory.c
# Opt level: O0

size_t JlMemoryReadCountValue(void *CountFieldPtr,size_t CountFieldSize)

{
  uint64_t *countElementInStructU64;
  uint32_t *countElementInStructU32;
  uint16_t *countElementInStructU16;
  uint8_t *countElementInStructU8;
  size_t countValue;
  size_t CountFieldSize_local;
  void *CountFieldPtr_local;
  
  countElementInStructU8 = (uint8_t *)0x0;
  if (CountFieldSize == 1) {
    countElementInStructU8 = (uint8_t *)(ulong)*CountFieldPtr;
  }
  else if (CountFieldSize == 2) {
    countElementInStructU8 = (uint8_t *)(ulong)*CountFieldPtr;
  }
  else if (CountFieldSize == 4) {
    countElementInStructU8 = (uint8_t *)(ulong)*CountFieldPtr;
  }
  else if (CountFieldSize == 8) {
    countElementInStructU8 = *CountFieldPtr;
  }
  return (size_t)countElementInStructU8;
}

Assistant:

size_t
    JlMemoryReadCountValue
    (
        void const*     CountFieldPtr,
        size_t          CountFieldSize
    )
{
    size_t countValue = 0;

    if( sizeof(uint8_t) == CountFieldSize )
    {
        uint8_t const* countElementInStructU8 = (uint8_t*)CountFieldPtr;
        countValue = *countElementInStructU8;
    }
    else if( sizeof(uint16_t) == CountFieldSize )
    {
        uint16_t const* countElementInStructU16 = (uint16_t*)CountFieldPtr;
        countValue = *countElementInStructU16;
    }
    else if( sizeof(uint32_t) == CountFieldSize )
    {
        uint32_t const* countElementInStructU32 = (uint32_t*)CountFieldPtr;
        countValue = *countElementInStructU32;
    }
    else if( sizeof(uint64_t) == CountFieldSize )
    {
        uint64_t const* countElementInStructU64 = (uint64_t*)CountFieldPtr;
        countValue = *countElementInStructU64;
    }
    // else:
    // Invalid size for count field. This should not be possible with the macros, so we don't return an error.
    // Just return a size of 0. If this happens there is some other internal error going on.

    return countValue;
}